

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O2

MultisampleConstPixelBufferAccess *
rr::getSubregion(MultisampleConstPixelBufferAccess *__return_storage_ptr__,
                MultisampleConstPixelBufferAccess *access,int x,int y,int width,int height)

{
  ConstPixelBufferAccess CStack_38;
  
  tcu::getSubregion(&CStack_38,&access->m_access,0,x,y,(access->m_access).m_size.m_data[0],width,
                    height);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&__return_storage_ptr__->m_access,&CStack_38);
  return __return_storage_ptr__;
}

Assistant:

MultisampleConstPixelBufferAccess getSubregion (const MultisampleConstPixelBufferAccess& access, int x, int y, int width, int height)
{
	return MultisampleConstPixelBufferAccess::fromMultisampleAccess(tcu::getSubregion(access.raw(), 0, x, y, access.getNumSamples(), width, height));
}